

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bif1sc(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  runcxdef *prVar2;
  objnum obj;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  prVar2 = ctx->bifcxrun;
  if (prVar1[-1].runstyp == '\x02') {
    obj = objget1sc(prVar2->runcxmem,(prVar2->runcxsp->runsv).runsvobj);
    runpobj(ctx->bifcxrun,obj);
    return;
  }
  prVar2->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3f2);
}

Assistant:

void bif1sc(bifcxdef *ctx, int argc)
{
    objnum obj;
    objnum sc;

    bifcntargs(ctx, 1, argc);
    obj = runpopobj(ctx->bifcxrun);
    sc = objget1sc(ctx->bifcxrun->runcxmem, obj);
    runpobj(ctx->bifcxrun, sc);
}